

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_ptr.hpp
# Opt level: O3

void __thiscall
duckdb::array_ptr<duckdb::Value,_true>::array_ptr
          (array_ptr<duckdb::Value,_true> *this,Value *ptr_p,idx_t count)

{
  InternalException *this_00;
  string local_40;
  
  this->ptr = ptr_p;
  this->count = count;
  if (ptr_p != (Value *)0x0) {
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Attempted to construct an array_ptr from a NULL pointer","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

array_ptr(DATA_TYPE *ptr_p, idx_t count) : ptr(ptr_p), count(count) {
		if (MemorySafety<SAFE>::ENABLED) {
			AssertNotNull(!ptr);
		}
	}